

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  ImVec2 IVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImRect *pIVar8;
  ImU32 col;
  ImVec2 *pIVar9;
  float fVar10;
  uint uVar11;
  ImVec2 IVar12;
  float fVar13;
  float fVar14;
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_78;
  ImDrawList *local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  ImVec2 local_40;
  float local_38;
  float local_34;
  
  IVar1 = *pos_min;
  local_78 = IVar1;
  local_70 = draw_list;
  if (text_size_if_known == (ImVec2 *)0x0) {
    local_68 = ZEXT416((uint)IVar1.x);
    IVar12 = CalcTextSize(text,text_display_end,false,0.0);
    fVar13 = (float)local_68._0_4_;
  }
  else {
    IVar12 = *text_size_if_known;
    fVar13 = IVar1.x;
  }
  fVar10 = IVar1.y;
  pIVar9 = &clip_rect->Max;
  pIVar8 = clip_rect;
  if (clip_rect == (ImRect *)0x0) {
    pIVar9 = pos_max;
    pIVar8 = (ImRect *)pos_min;
  }
  bVar2 = true;
  if (IVar12.x + fVar13 < pIVar9->x) {
    bVar2 = pIVar9->y <= IVar12.y + fVar10;
  }
  if (clip_rect != (ImRect *)0x0) {
    bVar3 = true;
    if ((clip_rect->Min).x <= fVar13) {
      bVar3 = fVar10 < (clip_rect->Min).y;
    }
    bVar2 = (bool)(bVar2 | bVar3);
  }
  if (0.0 < align->x) {
    fVar14 = ((pos_max->x - fVar13) - IVar12.x) * align->x + fVar13;
    uVar11 = -(uint)(fVar14 <= fVar13);
    local_78.x = (float)(uVar11 & (uint)fVar13 | ~uVar11 & (uint)fVar14);
  }
  if (0.0 < align->y) {
    fVar13 = ((pos_max->y - fVar10) - IVar12.y) * align->y + fVar10;
    uVar11 = -(uint)(fVar13 <= fVar10);
    local_78.y = (float)(uVar11 & (uint)fVar10 | ~uVar11 & (uint)fVar13);
  }
  if (bVar2) {
    local_34 = pIVar9->y;
    local_40 = pIVar8->Min;
    cpu_fine_clip_rect = (ImVec4 *)&local_40;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar4 = (GImGui->Style).Colors[0].z;
    uVar5 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar5;
    local_58.z = (float)uVar4;
    local_38 = pIVar9->x;
    col = ColorConvertFloat4ToU32(&local_58);
  }
  else {
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar6 = (GImGui->Style).Colors[0].z;
    uVar7 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar7;
    local_58.z = (float)uVar6;
    col = ColorConvertFloat4ToU32(&local_58);
    cpu_fine_clip_rect = (ImVec4 *)0x0;
  }
  ImDrawList::AddText(local_70,(ImFont *)0x0,0.0,&local_78,col,text,text_display_end,0.0,
                      cpu_fine_clip_rect);
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}